

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryEncoder.cc
# Opt level: O0

void __thiscall avro::BinaryEncoder::setItemCount(BinaryEncoder *this,size_t count)

{
  Exception *this_00;
  long in_RSI;
  string *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  BinaryEncoder *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (in_RSI == 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Exception::Exception(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  doEncodeLong(in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

void BinaryEncoder::setItemCount(size_t count)
{
    if (count == 0) {
        throw Exception("Count cannot be zero");
    }
    doEncodeLong(count);
}